

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void print_two_dimensions(int (*nums) [5],int rows,int cols)

{
  int local_20;
  int local_1c;
  int c;
  int r;
  int cols_local;
  int rows_local;
  int (*nums_local) [5];
  
  for (local_1c = 0; local_1c < rows; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < cols; local_20 = local_20 + 1) {
      printf("%i ",(ulong)(uint)nums[local_1c][local_20]);
    }
  }
  printf("\n");
  return;
}

Assistant:

void print_two_dimensions(int nums[][5], int rows, int cols) {
    for (int r=0; r<rows; r++) {
        for (int c=0; c<cols; c++) {
            printf("%i ", nums[r][c]);
        }
    }
    printf("\n");
}